

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d.cpp
# Opt level: O0

void load_model(test_model *model,bool use_gpu)

{
  void *pvVar1;
  undefined8 uVar2;
  byte bVar3;
  int iVar4;
  reference pvVar5;
  float *pfVar6;
  unsigned_short *puVar7;
  long lVar8;
  undefined8 uVar9;
  size_t sVar10;
  byte in_SIL;
  long *in_RDI;
  ggml_tallocr alloc;
  ggml_init_params params;
  int num_tensors;
  size_t buffer_size;
  int i_1;
  vector<float,_std::allocator<float>_> bdata;
  vector<unsigned_short,_std::allocator<unsigned_short>_> hadata;
  int i;
  vector<float,_std::allocator<float>_> adata;
  int N;
  int IH;
  int IW;
  int OC;
  int IC;
  int KH;
  int KW;
  undefined4 uVar11;
  undefined4 uVar12;
  allocator_type *in_stack_fffffffffffffe00;
  size_type in_stack_fffffffffffffe08;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe10;
  float local_154;
  undefined1 local_f8 [32];
  long local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  int local_a4;
  ulong local_a0;
  int local_98;
  vector<float,_std::allocator<float>_> local_90 [2];
  int local_58;
  vector<float,_std::allocator<float>_> local_40;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  byte local_9;
  long *local_8;
  
  local_9 = in_SIL & 1;
  local_10 = 3;
  local_14 = 3;
  local_18 = 10;
  local_1c = 10;
  local_20 = 8;
  local_24 = 6;
  local_28 = 1;
  local_8 = in_RDI;
  std::allocator<float>::allocator((allocator<float> *)0x10454c);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::allocator<float>::~allocator((allocator<float> *)0x104578);
  for (local_58 = 0; local_58 < local_10 * local_14 * local_18 * local_1c; local_58 = local_58 + 1)
  {
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_40,(long)local_58);
    *pvVar5 = 2.5;
  }
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x10464b);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08,(allocator_type *)in_stack_fffffffffffffe00);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x104677);
  pfVar6 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x104684);
  puVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x104699);
  ggml_fp32_to_fp16_row(pfVar6,puVar7,(long)(local_10 * local_14 * local_18 * local_1c));
  std::allocator<float>::allocator((allocator<float> *)0x104717);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::allocator<float>::~allocator((allocator<float> *)0x104743);
  for (local_98 = 0; local_98 < local_20 * local_24 * local_18 * local_28; local_98 = local_98 + 1)
  {
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_90,(long)local_98);
    *pvVar5 = 1.5;
  }
  local_a0 = 0;
  iVar4 = local_10 * local_14 * local_18 * local_1c;
  lVar8 = ggml_type_size(1);
  local_a0 = local_a0 + iVar4 * lVar8;
  iVar4 = local_20 * local_24 * local_18 * local_28;
  lVar8 = ggml_type_size(0);
  local_a0 = local_a0 + iVar4 * lVar8 + 0x400;
  printf("%s: ggml tensor size    = %d bytes\n","load_model",0x150);
  local_154 = (float)local_a0;
  printf("%s: backend buffer size = %0.2f MB\n",
         SUB84((double)(local_154 * 0.0009765625 * 0.0009765625),0),"load_model");
  local_a4 = 2;
  local_c0 = ggml_tensor_overhead();
  local_c0 = local_c0 * local_a4;
  uStack_b8 = 0;
  local_b0 = 1;
  ggml_log_set(ggml_log_callback_default,0);
  if (local_8[2] == 0) {
    lVar8 = ggml_backend_cpu_init();
    local_8[2] = lVar8;
  }
  lVar8 = ggml_backend_alloc_buffer(local_8[2],local_a0);
  local_8[3] = lVar8;
  uVar9 = CONCAT71(uStack_af,local_b0);
  local_d8 = local_c0;
  lVar8 = local_d8;
  uStack_d0 = uStack_b8;
  uVar2 = uStack_d0;
  local_d8._0_4_ = (undefined4)local_c0;
  uStack_d0._0_4_ = (undefined4)uStack_b8;
  uVar11 = (undefined4)local_d8;
  uVar12 = (undefined4)uStack_d0;
  local_d8 = lVar8;
  uStack_d0 = uVar2;
  local_c8 = uVar9;
  lVar8 = ggml_init();
  local_8[4] = lVar8;
  lVar8 = ggml_new_tensor_4d(local_8[4],1,(long)local_10,(long)local_14,(long)local_18,
                             (long)local_1c,uVar11,uVar12,uVar9);
  *local_8 = lVar8;
  lVar8 = ggml_new_tensor_4d(local_8[4],0,(long)local_20,(long)local_24,(long)local_18,
                             (long)local_28);
  local_8[1] = lVar8;
  ggml_tallocr_new(local_f8,local_8[3]);
  ggml_tallocr_alloc(local_f8,*local_8);
  bVar3 = ggml_backend_is_cpu(local_8[2]);
  if ((bVar3 & 1) == 0) {
    lVar8 = *local_8;
    puVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x104c75);
    uVar9 = ggml_nbytes(*local_8);
    ggml_backend_tensor_set(lVar8,puVar7,0,uVar9);
  }
  else {
    pvVar1 = *(void **)(*local_8 + 0xf8);
    puVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x104c26);
    sVar10 = ggml_nbytes(*local_8);
    memcpy(pvVar1,puVar7,sVar10);
  }
  ggml_tallocr_alloc(local_f8,local_8[1]);
  bVar3 = ggml_backend_is_cpu(local_8[2]);
  if ((bVar3 & 1) == 0) {
    in_stack_fffffffffffffe00 = (allocator_type *)local_8[1];
    pfVar6 = std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)0x104d5f);
    uVar9 = ggml_nbytes(local_8[1]);
    ggml_backend_tensor_set(in_stack_fffffffffffffe00,pfVar6,0,uVar9);
  }
  else {
    pvVar1 = *(void **)(local_8[1] + 0xf8);
    pfVar6 = std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)0x104d0e);
    sVar10 = ggml_nbytes(local_8[1]);
    memcpy(pvVar1,pfVar6,sVar10);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe00);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffe00);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe00);
  return;
}

Assistant:

void load_model(test_model & model, bool use_gpu = false) {
    // create data
    int KW = 3, KH = 3, IC = 10, OC = 10;
    int IW = 8, IH = 6, N = 1;

    // Initialize adata
    std::vector<float> adata(KW * KH * IC * OC);
    for (int i = 0; i < KW * KH * IC * OC; i++) {
        adata[i] = 2.5f;
    }

    // Convert adata to fp16 format
    std::vector<ggml_fp16_t> hadata(KW * KH * IC * OC);
    ggml_fp32_to_fp16_row(adata.data(), hadata.data(), KW * KH * IC * OC);

    // Initialize bdata
    std::vector<float> bdata(IW * IH * IC * N);
    for (int i = 0; i < IW * IH * IC * N; i++) {
        bdata[i] = 1.5f;
    }

    size_t buffer_size = 0;
    {
        buffer_size += KW * KH * IC * OC * ggml_type_size(GGML_TYPE_F16); // tensor a
        buffer_size += IW * IH * IC * N  * ggml_type_size(GGML_TYPE_F32); // tensor b
        buffer_size += 1024; // overhead
    }

    printf("%s: ggml tensor size    = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
    printf("%s: backend buffer size = %0.2f MB\n", __func__, (buffer_size/ 1024.f/ 1024.f));

    int num_tensors = 2;
    struct ggml_init_params params {
            /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
    };

    ggml_log_set(ggml_log_callback_default, nullptr);

    // initialize the backend
#ifdef GGML_USE_CUDA
    if (use_gpu) {
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        model.backend = ggml_backend_cuda_init(0);
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
    }
#endif

#ifdef GGML_USE_METAL
    if (use_gpu) {
        fprintf(stderr, "%s: using Metal backend\n", __func__);
        model.backend = ggml_backend_metal_init();
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
        }
    }
#endif

    if(!model.backend) {
        // fallback to CPU backend
        model.backend = ggml_backend_cpu_init();
    }

    model.buffer = ggml_backend_alloc_buffer(model.backend, buffer_size);

    // create context
    model.ctx = ggml_init(params);

    // create tensors
    model.a = ggml_new_tensor_4d(model.ctx, GGML_TYPE_F16,  KW, KH, IC, OC);
    model.b = ggml_new_tensor_4d(model.ctx, GGML_TYPE_F32, IW, IH, IC, N);

    // create a allocator
    struct ggml_tallocr alloc = ggml_tallocr_new(model.buffer);

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.a);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a->data, hadata.data(), ggml_nbytes(model.a));
    } else {
        ggml_backend_tensor_set(model.a, hadata.data(), 0, ggml_nbytes(model.a));
    }

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.b);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b->data, bdata.data(), ggml_nbytes(model.b));
    } else {
        ggml_backend_tensor_set(model.b, bdata.data(), 0, ggml_nbytes(model.b));
    }
}